

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor * ggml_graph_get_parent(ggml_cgraph *cgraph,ggml_tensor *node)

{
  ggml_tensor *parent;
  int i;
  ggml_tensor *node_local;
  ggml_cgraph *cgraph_local;
  
  i = 0;
  while( true ) {
    if (cgraph->n_nodes <= i) {
      return (ggml_tensor *)0x0;
    }
    if (cgraph->nodes[i]->grad == node) break;
    i = i + 1;
  }
  return cgraph->nodes[i];
}

Assistant:

static struct ggml_tensor * ggml_graph_get_parent(const struct ggml_cgraph * cgraph, const struct ggml_tensor * node) {
    for (int i = 0; i < cgraph->n_nodes; i++) {
        struct ggml_tensor * parent = cgraph->nodes[i];

        if (parent->grad == node) {
            return parent;
        }
    }

    return NULL;
}